

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RunLength.cc
# Opt level: O2

void __thiscall Pl_RunLength::finish(Pl_RunLength *this)

{
  Members *pMVar1;
  Pipeline *pPVar2;
  undefined8 in_RAX;
  runtime_error *this_00;
  undefined7 uStack_18;
  uchar ch;
  
  pMVar1 = (this->m)._M_t.
           super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
           ._M_t.
           super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
           .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
  _uStack_18 = in_RAX;
  if (pMVar1->action == a_encode) {
    flush_encode(this);
    _uStack_18 = CONCAT17(0x80,uStack_18);
    pPVar2 = (this->super_Pipeline).next_;
    (*pPVar2->_vptr_Pipeline[2])(pPVar2,&ch,1);
  }
  else {
    if (((anonymous_namespace)::memory_limit != 0) &&
       ((anonymous_namespace)::memory_limit < (pMVar1->out)._M_string_length)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Pl_RunLength memory limit exceeded");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Pipeline::writeString((this->super_Pipeline).next_,&pMVar1->out);
  }
  (*((this->super_Pipeline).next_)->_vptr_Pipeline[3])();
  return;
}

Assistant:

void
Pl_RunLength::finish()
{
    // When decoding, we might have read a length byte not followed by data, which means the stream
    // was terminated early, but we will just ignore this case since this is the only sensible thing
    // to do.
    if (m->action == a_encode) {
        flush_encode();
        unsigned char ch = 128;
        next()->write(&ch, 1);
    } else {
        if (memory_limit && (m->out.size()) > memory_limit) {
            throw std::runtime_error("Pl_RunLength memory limit exceeded");
        }
        next()->writeString(m->out);
    }
    next()->finish();
}